

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool IsArith(expr_node *node)

{
  bool bVar1;
  
  if ((node->type != '\x05') || (bVar1 = true, 3 < (node->value).integer - 1U)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IsArith(const expr_node* node)
{
    if (
        node->type == OP &&
        (node->value.integer == ADD || node->value.integer == SUB ||
        node->value.integer == MUL || node->value.integer == DIV)
    )
        return true;
    else
        return false;
}